

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<12,_12,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  undefined8 *puVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  Matrix<float,_3,_4> *mat;
  Matrix<float,_3,_4> *mat_00;
  long lVar6;
  undefined8 *puVar7;
  undefined4 uVar8;
  Vector<float,_3> res_3;
  Vector<float,_3> res;
  Vector<float,_3> res_5;
  Vector<float,_3> res_2;
  Type in0;
  Vector<float,_3> res_1;
  float afStack_e8 [6];
  Vec4 *local_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  float local_b8 [4];
  float local_a8 [4];
  undefined8 local_98;
  float fStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  float fStack_84;
  undefined8 uStack_80;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  float fStack_6c;
  Matrix<float,_3,_4> local_68;
  Matrix<float,_3,_4> local_38;
  
  puVar2 = &local_98;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)puVar2 + lVar6) = uVar8;
        lVar6 = lVar6 + 0xc;
      } while (lVar6 != 0x30);
      lVar5 = lVar5 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      lVar3 = lVar3 + 0xc;
    } while (lVar5 != 3);
    local_98 = *(undefined8 *)evalCtx->in[0].m_data;
    fStack_90 = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    fStack_84 = evalCtx->in[1].m_data[2];
    uStack_8c = (undefined4)uVar1;
    uStack_88 = (undefined4)((ulong)uVar1 >> 0x20);
    uStack_80 = *(undefined8 *)evalCtx->in[2].m_data;
    local_78 = evalCtx->in[2].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[3].m_data;
    fStack_6c = evalCtx->in[3].m_data[2];
    uStack_74 = (undefined4)uVar1;
    uStack_70 = (undefined4)((ulong)uVar1 >> 0x20);
    mat = (Matrix<float,_3,_4> *)0x3;
  }
  else {
    local_78 = 0.0;
    uStack_74 = 0;
    uStack_70 = 0;
    fStack_6c = 0.0;
    uStack_88 = 0;
    fStack_84 = 0.0;
    uStack_80 = 0;
    local_98 = 0;
    fStack_90 = 0.0;
    uStack_8c = 0;
    puVar4 = &sr::(anonymous_namespace)::s_constInMat4x3;
    mat = (Matrix<float,_3,_4> *)0x0;
    do {
      lVar3 = 0;
      puVar7 = puVar2;
      do {
        *(undefined4 *)puVar7 = puVar4[lVar3];
        lVar3 = lVar3 + 1;
        puVar7 = (undefined8 *)((long)puVar7 + 0xc);
      } while (lVar3 != 4);
      mat = (Matrix<float,_3,_4> *)((long)(mat->m_data).m_data[0].m_data + 1);
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      puVar4 = puVar4 + 4;
    } while (mat != (Matrix<float,_3,_4> *)0x3);
  }
  sr::(anonymous_namespace)::MatrixCaseUtils::decrement<float,3,4>
            (&local_38,(MatrixCaseUtils *)&local_98,mat);
  local_c8 = (ulong)local_c8._4_4_ << 0x20;
  local_d0 = (Vec4 *)0x0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_d0 + lVar3 * 4) =
         local_38.m_data.m_data[0].m_data[lVar3] + local_38.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_68.m_data.m_data[0].m_data[2] = 0.0;
  local_68.m_data.m_data[0].m_data[0] = 0.0;
  local_68.m_data.m_data[0].m_data[1] = 0.0;
  lVar3 = 0;
  do {
    local_68.m_data.m_data[0].m_data[lVar3] =
         *(float *)((long)&local_d0 + lVar3 * 4) + local_38.m_data.m_data[2].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_a8[2] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  lVar3 = 0;
  do {
    local_a8[lVar3] =
         local_68.m_data.m_data[0].m_data[lVar3] + local_38.m_data.m_data[3].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  sr::(anonymous_namespace)::MatrixCaseUtils::decrement<float,3,4>
            (&local_68,(MatrixCaseUtils *)&local_98,mat_00);
  afStack_e8[4] = 0.0;
  afStack_e8[2] = 0.0;
  afStack_e8[3] = 0.0;
  lVar3 = 0;
  do {
    afStack_e8[lVar3 + 2] =
         local_68.m_data.m_data[0].m_data[lVar3] + local_68.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_c8 = local_c8 & 0xffffffff00000000;
  local_d0 = (Vec4 *)0x0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_d0 + lVar3 * 4) =
         afStack_e8[lVar3 + 2] + local_68.m_data.m_data[2].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_b8[2] = 0.0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  lVar3 = 0;
  do {
    local_b8[lVar3] =
         *(float *)((long)&local_d0 + lVar3 * 4) +
         *(float *)((long)(local_38.m_data.m_data + -1) + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  afStack_e8[2] = 0.0;
  afStack_e8[3] = 0.0;
  afStack_e8[4] = 0.0;
  lVar3 = 0;
  do {
    afStack_e8[lVar3 + 2] = local_a8[lVar3] + local_b8[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_d0 = &evalCtx->color;
  local_c8 = 0x100000000;
  local_c0 = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_d0 + lVar3 * 4)] = afStack_e8[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(in0)) + reduceToVec3(decrement(in0));
	}